

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatTest_OutputIterators_Test::TestBody(FormatTest_OutputIterators_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  char *pcVar5;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  args_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  list<char,_std::allocator<char>_> out;
  stringstream s;
  AssertHelper local_208;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  range local_1d0;
  _List_node_base local_1c0;
  undefined8 local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [4];
  ios_base local_128 [272];
  
  local_1c0._M_next = &local_1c0;
  local_1b0 = 0;
  local_1a8[0]._M_dataplus._M_p = &DAT_0000002a;
  format_str.size_ = 2;
  format_str.data_ = "{}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
        *)local_1a8;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>,int>
                ::TYPES;
  local_1c0._M_prev = local_1c0._M_next;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
            ((range)local_1c0._M_next,format_str,args,(locale_ref)0x0);
  paVar1 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<std::_List_iterator<char>>
            ((string *)local_1a8,local_1c0._M_next,&local_1c0);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_1f0,"\"42\"","std::string(out.begin(), out.end())",
             (char (*) [3])0x242e5f,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p);
  }
  if ((char)local_1f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_1a8);
    if ((undefined8 *)local_1f0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x7f9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_1a8[0]._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  local_208.data_ = (AssertHelperData *)&DAT_0000002a;
  local_1f0._M_string_length = 0;
  format_str_00.size_ = (size_t)"{}";
  format_str_00.data_ = (char *)&local_1f0;
  args_00.field_1.args_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>,int>
       ::TYPES.args_;
  args_00.types_ = 2;
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>,char,fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            (&local_1d0,format_str_00,args_00,(locale_ref)&local_208);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_208,"\"42\"","s.str()",(char (*) [3])0x242e5f,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (local_208.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    if (local_200[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_200[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x7fc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_1f0._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_200,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  p_Var3 = local_1c0._M_next;
  while (p_Var3 != &local_1c0) {
    p_Var2 = (((_List_base<char,_std::allocator<char>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  return;
}

Assistant:

TEST(FormatTest, OutputIterators) {
  std::list<char> out;
  fmt::format_to(std::back_inserter(out), "{}", 42);
  EXPECT_EQ("42", std::string(out.begin(), out.end()));
  std::stringstream s;
  fmt::format_to(std::ostream_iterator<char>(s), "{}", 42);
  EXPECT_EQ("42", s.str());
}